

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::GenerateSetObjectTypeFromInlineCache
          (Lowerer *this,Instr *instrToInsertBefore,RegOpnd *opndBase,RegOpnd *opndInlineCache,
          bool isTypeTagged)

{
  RegOpnd *dst;
  IndirOpnd *pIVar1;
  IntConstOpnd *src2;
  undefined7 in_register_00000081;
  
  dst = IR::RegOpnd::New(TyInt64,instrToInsertBefore->m_func);
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,0,TyInt64,instrToInsertBefore->m_func,false);
  InsertMove(&dst->super_Opnd,&pIVar1->super_Opnd,instrToInsertBefore,true);
  if ((int)CONCAT71(in_register_00000081,isTypeTagged) != 0) {
    src2 = IR::IntConstOpnd::New(-5,TyInt64,instrToInsertBefore->m_func,true);
    InsertAnd(&dst->super_Opnd,&dst->super_Opnd,&src2->super_Opnd,instrToInsertBefore);
  }
  pIVar1 = IR::IndirOpnd::New(opndBase,8,TyInt64,instrToInsertBefore->m_func,false);
  InsertMove(&pIVar1->super_Opnd,&dst->super_Opnd,instrToInsertBefore,true);
  return;
}

Assistant:

void
Lowerer::GenerateSetObjectTypeFromInlineCache(
    IR::Instr * instrToInsertBefore,
    IR::RegOpnd * opndBase,
    IR::RegOpnd * opndInlineCache,
    bool isTypeTagged)
{
    // regNewType = MOV [&(inlineCache->u.local.type)]
    IR::RegOpnd * regNewType = IR::RegOpnd::New(TyMachReg, instrToInsertBefore->m_func);
    IR::IndirOpnd * memNewType = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.local.type), TyMachReg, instrToInsertBefore->m_func);
    InsertMove(regNewType, memNewType, instrToInsertBefore);

    // AND regNewType, ~InlineCacheAuxSlotTypeTag
    if (isTypeTagged)
    {
        // On 64-bit platforms IntConstOpnd isn't big enough to hold TyMachReg values.
        IR::IntConstOpnd * constTypeTagComplement = IR::IntConstOpnd::New(~InlineCacheAuxSlotTypeTag, TyMachReg, instrToInsertBefore->m_func, /* dontEncode = */ true);
        InsertAnd(regNewType, regNewType, constTypeTagComplement, instrToInsertBefore);
    }

    // MOV base->type, regNewType
    IR::IndirOpnd * memObjType = IR::IndirOpnd::New(opndBase, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, instrToInsertBefore->m_func);
    InsertMove(memObjType, regNewType, instrToInsertBefore);
}